

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBufferObjectUtil.cpp
# Opt level: O0

SharedPtr<vkt::Draw::Buffer> __thiscall
vkt::Draw::Buffer::create
          (Buffer *this,DeviceInterface *vk,VkDevice device,VkBufferCreateInfo *createInfo)

{
  VkBufferCreateInfo *device_00;
  VkDevice vk_00;
  Buffer *this_00;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<vkt::Draw::Buffer> SVar1;
  Move<vk::Handle<(vk::HandleType)8>_> local_48;
  VkBufferCreateInfo *local_28;
  VkBufferCreateInfo *createInfo_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  local_28 = createInfo;
  createInfo_local = (VkBufferCreateInfo *)device;
  device_local = (VkDevice)vk;
  vk_local = (DeviceInterface *)this;
  this_00 = (Buffer *)operator_new(0x40);
  vk_00 = device_local;
  device_00 = createInfo_local;
  ::vk::createBuffer(&local_48,(DeviceInterface *)device_local,(VkDevice)createInfo_local,local_28,
                     (VkAllocationCallbacks *)0x0);
  Buffer(this_00,(DeviceInterface *)vk_00,(VkDevice)device_00,&local_48);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr((SharedPtr<vkt::Draw::Buffer> *)this,this_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_48);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = this;
  return SVar1;
}

Assistant:

de::SharedPtr<Buffer> Buffer::create (const vk::DeviceInterface& vk,
									  vk::VkDevice device,
									  const vk::VkBufferCreateInfo& createInfo)
{
	return de::SharedPtr<Buffer>(new Buffer(vk, device, vk::createBuffer(vk, device, &createInfo)));
}